

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_ObjFinFon(Cba_Ntk_t *p,int i,int k)

{
  int *piVar1;
  uint uVar2;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                  ,0xfe,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
  }
  if (i < (p->vObjFin0).nSize) {
    piVar1 = (p->vObjFin0).pArray + (uint)i;
    uVar2 = k + *piVar1;
    if (uVar2 == 0 || SCARRY4(k,*piVar1) != (int)uVar2 < 0) {
      __assert_fail("f>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                    ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
    }
    if ((int)uVar2 < (p->vFinFon).nSize) {
      return (p->vFinFon).pArray[uVar2];
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int            Cba_ObjFinFon( Cba_Ntk_t * p, int i, int k )    { assert(i>0); return Cba_FinFon(p, Cba_ObjFin(p, i, k));                                     }